

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

bool __thiscall axl::io::MappedFile::setSize(MappedFile *this,uint64_t size)

{
  bool bVar1;
  uint64_t in_stack_ffffffffffffffa8;
  File *in_stack_ffffffffffffffb0;
  uint_t in_stack_ffffffffffffffdc;
  ErrorRef *in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = MappedViewMgr::isEmpty((MappedViewMgr *)0x16f7e1);
  if ((bVar1) && (bVar1 = MappedViewMgr::isEmpty((MappedViewMgr *)0x16f7f5), bVar1)) {
    local_1 = File::setSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    err::setError((ErrorRef *)0x16f817);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x16f823);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
MappedFile::setSize(uint64_t size) {
	if (!m_permanentViewMgr.isEmpty() ||
		!m_dynamicViewMgr.isEmpty()) {
		err::setError(err::SystemErrorCode_InvalidDeviceState);
		return false;
	}

	return m_file.setSize(size);
}